

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall
o3dgc::Static_Data_Model::set_distribution
          (Static_Data_Model *this,uint number_of_symbols,double *probability)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint *puVar5;
  uint local_3c;
  uint w;
  uint k;
  double p;
  double sum;
  uint s;
  uint table_bits;
  double *probability_local;
  uint number_of_symbols_local;
  Static_Data_Model *this_local;
  
  if ((number_of_symbols < 2) || (0x800 < number_of_symbols)) {
    AC_Error("invalid number of data symbols");
  }
  if (this->data_symbols != number_of_symbols) {
    this->data_symbols = number_of_symbols;
    this->last_symbol = this->data_symbols - 1;
    if (this->distribution != (uint *)0x0) {
      operator_delete__(this->distribution);
    }
    if (this->data_symbols < 0x11) {
      this->decoder_table = (uint *)0x0;
      this->table_shift = 0;
      this->table_size = 0;
      auVar3 = ZEXT416(this->data_symbols) * ZEXT816(4);
      uVar4 = auVar3._0_8_;
      if (auVar3._8_8_ != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      puVar5 = (uint *)operator_new__(uVar4);
      this->distribution = puVar5;
    }
    else {
      sum._4_4_ = 3;
      while ((uint)(1 << ((byte)sum._4_4_ + 2 & 0x1f)) < this->data_symbols) {
        sum._4_4_ = sum._4_4_ + 1;
      }
      this->table_size = 1 << ((byte)sum._4_4_ & 0x1f);
      this->table_shift = 0xf - sum._4_4_;
      auVar3 = ZEXT416(this->data_symbols + this->table_size + 2) * ZEXT816(4);
      uVar4 = auVar3._0_8_;
      if (auVar3._8_8_ != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      puVar5 = (uint *)operator_new__(uVar4);
      this->distribution = puVar5;
      this->decoder_table = this->distribution + this->data_symbols;
    }
    if (this->distribution == (uint *)0x0) {
      AC_Error("cannot assign model memory");
    }
  }
  sum._0_4_ = 0;
  p = 0.0;
  _w = 1.0 / (double)this->data_symbols;
  for (local_3c = 0; local_3c < this->data_symbols; local_3c = local_3c + 1) {
    if (probability != (double *)0x0) {
      _w = probability[local_3c];
    }
    if ((_w < 0.0001) || (0.9999 < _w)) {
      AC_Error("invalid symbol probability");
    }
    this->distribution[local_3c] = (uint)(long)(p * 32768.0);
    p = _w + p;
    if (this->table_size != 0) {
      uVar1 = this->distribution[local_3c];
      uVar2 = this->table_shift;
      while (sum._0_4_ < uVar1 >> ((byte)uVar2 & 0x1f)) {
        sum._0_4_ = sum._0_4_ + 1;
        this->decoder_table[sum._0_4_] = local_3c - 1;
      }
    }
  }
  if (this->table_size != 0) {
    *this->decoder_table = 0;
    while (sum._0_4_ <= this->table_size) {
      sum._0_4_ = sum._0_4_ + 1;
      this->decoder_table[sum._0_4_] = this->data_symbols - 1;
    }
  }
  if ((p < 0.9999) || (1.0001 < p)) {
    AC_Error("invalid probabilities");
  }
  return;
}

Assistant:

void Static_Data_Model::set_distribution(unsigned number_of_symbols,
                                             const double probability[])
    {
      if ((number_of_symbols < 2) || (number_of_symbols > (1 << 11)))
        AC_Error("invalid number of data symbols");

      if (data_symbols != number_of_symbols) {     // assign memory for data model
        data_symbols = number_of_symbols;
        last_symbol = data_symbols - 1;
        delete [] distribution;
                                         // define size of table for fast decoding
        if (data_symbols > 16) {
          unsigned table_bits = 3;
          while (data_symbols > (1U << (table_bits + 2))) ++table_bits;
          table_size  = 1 << table_bits;
          table_shift = DM__LengthShift - table_bits;
          distribution = new unsigned[data_symbols+table_size+2];
          decoder_table = distribution + data_symbols;
        }
        else {                                  // small alphabet: no table needed
          decoder_table = 0;
          table_size = table_shift = 0;
          distribution = new unsigned[data_symbols];
        }
        if (distribution == 0) AC_Error("cannot assign model memory");
      }
                                 // compute cumulative distribution, decoder table
      unsigned s = 0;
      double sum = 0.0, p = 1.0 / double(data_symbols);

      for (unsigned k = 0; k < data_symbols; k++) {
        if (probability) p = probability[k];
        if ((p < 0.0001) || (p > 0.9999)) AC_Error("invalid symbol probability");
        distribution[k] = unsigned(sum * (1 << DM__LengthShift));
        sum += p;
        if (table_size == 0) continue;
        unsigned w = distribution[k] >> table_shift;
        while (s < w) decoder_table[++s] = k - 1;
      }

      if (table_size != 0) {
        decoder_table[0] = 0;
        while (s <= table_size) decoder_table[++s] = data_symbols - 1;
      }

      if ((sum < 0.9999) || (sum > 1.0001)) AC_Error("invalid probabilities");
    }